

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

int Abc_NtkCombinePos(Abc_Ntk_t *pNtk,int fAnd,int fXor)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int local_34;
  Abc_Obj_t *pAStack_30;
  int i;
  Abc_Obj_t *pMiter;
  Abc_Obj_t *pNode;
  int fXor_local;
  int fAnd_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x486,"int Abc_NtkCombinePos(Abc_Ntk_t *, int, int)");
  }
  iVar2 = Abc_NtkPoNum(pNtk);
  if (iVar2 == 1) {
    pNtk_local._4_4_ = 1;
  }
  else {
    if (fAnd == 0) {
      pAVar3 = Abc_AigConst1(pNtk);
      pAStack_30 = Abc_ObjNot(pAVar3);
    }
    else {
      pAStack_30 = Abc_AigConst1(pNtk);
    }
    for (local_34 = 0; iVar2 = Abc_NtkPoNum(pNtk), local_34 < iVar2; local_34 = local_34 + 1) {
      pAVar3 = Abc_NtkPo(pNtk,local_34);
      if (fAnd == 0) {
        if (fXor == 0) {
          pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
          pAVar3 = Abc_ObjChild0(pAVar3);
          pAStack_30 = Abc_AigOr(pAVar1,pAStack_30,pAVar3);
        }
        else {
          pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
          pAVar3 = Abc_ObjChild0(pAVar3);
          pAStack_30 = Abc_AigXor(pAVar1,pAStack_30,pAVar3);
        }
      }
      else {
        pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
        pAVar3 = Abc_ObjChild0(pAVar3);
        pAStack_30 = Abc_AigAnd(pAVar1,pAStack_30,pAVar3);
      }
    }
    local_34 = Abc_NtkPoNum(pNtk);
    while (local_34 = local_34 + -1, -1 < local_34) {
      pAVar3 = Abc_NtkPo(pNtk,local_34);
      Abc_NtkDeleteObj(pAVar3);
    }
    iVar2 = Abc_NtkPoNum(pNtk);
    if (iVar2 != 0) {
      __assert_fail("Abc_NtkPoNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                    ,0x49a,"int Abc_NtkCombinePos(Abc_Ntk_t *, int, int)");
    }
    pAVar3 = Abc_NtkCreatePo(pNtk);
    Abc_ObjAddFanin(pAVar3,pAStack_30);
    Abc_ObjAssignName(pAVar3,"miter",(char *)0x0);
    Abc_NtkOrderCisCos(pNtk);
    iVar2 = Abc_NtkCheck(pNtk);
    if (iVar2 == 0) {
      printf("Abc_NtkOrPos: The network check has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      pNtk_local._4_4_ = 1;
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkCombinePos( Abc_Ntk_t * pNtk, int fAnd, int fXor )
{
    Abc_Obj_t * pNode, * pMiter;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
//    assert( Abc_NtkLatchNum(pNtk) == 0 );
    if ( Abc_NtkPoNum(pNtk) == 1 )
        return 1;
    // start the result
    if ( fAnd )
        pMiter = Abc_AigConst1(pNtk);
    else
        pMiter = Abc_ObjNot( Abc_AigConst1(pNtk) );
    // perform operations on the POs
    Abc_NtkForEachPo( pNtk, pNode, i )
        if ( fAnd )
            pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
        else if ( fXor )
            pMiter = Abc_AigXor( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
        else
            pMiter = Abc_AigOr( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
    // remove the POs and their names
    for ( i = Abc_NtkPoNum(pNtk) - 1; i >= 0; i-- )
        Abc_NtkDeleteObj( Abc_NtkPo(pNtk, i) );
    assert( Abc_NtkPoNum(pNtk) == 0 );
    // create the new PO
    pNode = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pNode, pMiter );
    Abc_ObjAssignName( pNode, "miter", NULL );
    Abc_NtkOrderCisCos( pNtk );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkOrPos: The network check has failed.\n" );
        return 0;
    }
    return 1;
}